

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O0

int memory_equal_display_error(char *a,char *b,size_t size)

{
  ulong in_RDX;
  long in_RSI;
  long in_RDI;
  char r;
  char l;
  size_t i;
  size_t differences;
  ulong local_30;
  ulong local_28;
  int local_4;
  
  local_28 = 0;
  for (local_30 = 0; local_30 < in_RDX; local_30 = local_30 + 1) {
    if (*(char *)(in_RDI + local_30) != *(char *)(in_RSI + local_30)) {
      if (local_28 < 0x10) {
        cm_print_error("difference at offset %zd 0x%02x 0x%02x\n",local_30,
                       (ulong)(uint)(int)*(char *)(in_RDI + local_30),
                       (ulong)(uint)(int)*(char *)(in_RSI + local_30));
      }
      local_28 = local_28 + 1;
    }
  }
  if (local_28 == 0) {
    local_4 = 1;
  }
  else {
    if (0xf < local_28) {
      cm_print_error("...\n");
    }
    cm_print_error("%zd bytes of %p and %p differ\n",local_28,in_RDI,in_RSI);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int memory_equal_display_error(const char* const a, const char* const b,
                                      const size_t size) {
    size_t differences = 0;
    size_t i;
    for (i = 0; i < size; i++) {
        const char l = a[i];
        const char r = b[i];
        if (l != r) {
            if (differences < 16) {
                cm_print_error("difference at offset %" PRIdS " 0x%02x 0x%02x\n",
                               i, l, r);
            }
            differences ++;
        }
    }
    if (differences > 0) {
        if (differences >= 16) {
            cm_print_error("...\n");
        }
        cm_print_error("%"PRIdS " bytes of %p and %p differ\n",
                       differences, (void *)a, (void *)b);
        return 0;
    }
    return 1;
}